

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.hpp
# Opt level: O0

hugeint_t duckdb::Cast::Operation<duckdb::timestamp_t,_duckdb::hugeint_t>(timestamp_t input)

{
  hugeint_t hVar1;
  bool bVar2;
  InvalidInputException *this;
  hugeint_t *in_RDI;
  hugeint_t result;
  timestamp_t in_stack_00000198;
  string *in_stack_ffffffffffffff98;
  timestamp_t in_stack_fffffffffffffff0;
  int64_t local_8;
  
  bVar2 = TryCast::Operation<duckdb::timestamp_t,_duckdb::hugeint_t>
                    (in_stack_fffffffffffffff0,in_RDI,SUB81((ulong)in_RDI >> 0x38,0));
  if (!bVar2) {
    this = (InvalidInputException *)__cxa_allocate_exception(0x10);
    CastExceptionText<duckdb::timestamp_t,_duckdb::hugeint_t>(in_stack_00000198);
    InvalidInputException::InvalidInputException(this,in_stack_ffffffffffffff98);
    __cxa_throw(this,&InvalidInputException::typeinfo,InvalidInputException::~InvalidInputException)
    ;
  }
  hVar1.upper = local_8;
  hVar1.lower = in_stack_fffffffffffffff0.value;
  return hVar1;
}

Assistant:

static inline DST Operation(SRC input) {
		DST result;
		if (!TryCast::Operation(input, result)) {
			throw InvalidInputException(CastExceptionText<SRC, DST>(input));
		}
		return result;
	}